

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

void linearize_store_var(Proc *proc,VariableType *var_type,Pseudo *var_pseudo,VariableType *val_type
                        ,Pseudo *val_pseudo,uint line_number)

{
  uint uVar1;
  Pseudo *pseudo;
  Pseudo *pseudo_00;
  int iVar2;
  ravitype_t rVar3;
  Instruction *insn;
  Pseudo *pseudo_01;
  ravitype_t rVar4;
  ravitype_t rVar5;
  opcode op;
  opcode oStack_40;
  
  if (((undefined1  [48])*var_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    if ((undefined1  [40])((undefined1  [40])var_pseudo->field_3 & (undefined1  [40])0x100000000) ==
        (undefined1  [40])0x0) {
      uVar1 = (var_pseudo->field_3).range_in_use;
      if (uVar1 == 0x40) {
        op = val_type->type_code == RAVI_TNUMFLT | op_faput;
      }
      else if (uVar1 == 0x20) {
        op = val_type->type_code == RAVI_TNUMINT | op_iaput;
      }
      else {
        rVar3 = (var_pseudo->field_3).index_info.key_type;
        iVar2 = (uint)(uVar1 == 0x80) * 3;
        op = iVar2 + op_put;
        if (rVar3 == RAVI_TSTRING) {
          op = iVar2 + op_put_skey;
        }
        else if (rVar3 == RAVI_TNUMINT) {
          op = iVar2 + op_put_ikey;
        }
      }
      pseudo = (var_pseudo->field_3).index_info.container;
      if (((undefined1  [48])*pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x5b4,"void indexed_store(Proc *, Pseudo *, Pseudo *, ravitype_t)");
      }
      pseudo_00 = (var_pseudo->field_3).index_info.key;
      if (((undefined1  [48])*pseudo_00 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
        __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x5b5,"void indexed_store(Proc *, Pseudo *, Pseudo *, ravitype_t)");
      }
      insn = allocate_instruction(proc,op,(var_pseudo->field_3).index_info.line_number);
      pseudo_01 = add_instruction_operand(proc,insn,val_pseudo);
      add_instruction_target(proc,insn,pseudo);
      add_instruction_target(proc,insn,pseudo_00);
    }
    else {
      insn = allocate_instruction(proc,op_storeglobal,(var_pseudo->field_3).index_info.line_number);
      pseudo_01 = add_instruction_operand(proc,insn,val_pseudo);
      add_instruction_target(proc,insn,(var_pseudo->field_3).index_info.container);
      add_instruction_target(proc,insn,(var_pseudo->field_3).index_info.key);
    }
    add_instruction(proc,insn);
    if (pseudo_01 == (Pseudo *)0x0) {
      return;
    }
    free_temp_pseudo(proc,pseudo_01,false);
    return;
  }
  rVar3 = var_type->type_code;
  oStack_40 = op_mov;
  if (rVar3 == RAVI_TANY) goto LAB_0011916e;
  if ((rVar3 == RAVI_TVARARGS) || (rVar3 == RAVI_TNIL)) {
    __assert_fail("var_type->type_code != RAVI_TVARARGS && var_type->type_code != RAVI_TNIL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x6c9,
                  "void linearize_store_var(Proc *, const VariableType *, Pseudo *, const VariableType *, Pseudo *, unsigned int)"
                 );
  }
  uVar1 = (uint)(rVar3 + ~RAVI_TBOOLEAN) >> 3;
  if (((uint)(uVar1 | rVar3 << 0x1d) < 8) && ((0x8bU >> (uVar1 & 0x1f) & 1) != 0)) {
    rVar5 = val_type->type_code;
LAB_00119053:
    if ((rVar5 != rVar3) || (rVar4 = rVar3, val_type->type_name != var_type->type_name)) {
      if (rVar3 == RAVI_TNUMINT) {
        if (rVar5 == RAVI_TNUMFLT) {
          oStack_40 = op_movfi;
          goto LAB_0011916e;
        }
      }
      else if ((rVar3 == RAVI_TNUMFLT) && (rVar5 == RAVI_TNUMINT)) {
        oStack_40 = op_movif;
        goto LAB_0011916e;
      }
      instruct_totype(proc,val_pseudo,var_type,line_number);
      rVar3 = var_type->type_code;
      rVar4 = rVar3;
    }
  }
  else {
    rVar5 = val_type->type_code;
    if (rVar5 != RAVI_TNIL) goto LAB_00119053;
    rVar4 = RAVI_TNIL;
  }
  if (rVar3 == RAVI_TNUMFLT) {
    oStack_40 = rVar4 == RAVI_TNUMFLT | op_movif;
  }
  else if (rVar3 == RAVI_TNUMINT) {
    oStack_40 = (uint)(rVar4 != RAVI_TNUMINT) * 3 + op_movi;
  }
LAB_0011916e:
  instruct_move(proc,oStack_40,var_pseudo,val_pseudo,line_number);
  return;
}

Assistant:

static void linearize_store_var(Proc *proc, const VariableType *var_type, Pseudo *var_pseudo,
				const VariableType *val_type, Pseudo *val_pseudo, unsigned line_number)
{
	if (var_pseudo->type == PSEUDO_INDEXED) {
		indexed_store(proc, var_pseudo, val_pseudo, val_type->type_code);
	}
	else {
		assert(var_type->type_code != RAVI_TVARARGS && var_type->type_code != RAVI_TNIL);
		if (!is_compatible(var_type, val_type)) {
			instruct_totype(proc, val_pseudo, var_type, line_number);
			val_type = var_type; // Because of the type assertion!
		}
		enum opcode op = op_mov;
		if (var_type->type_code == RAVI_TNUMINT) {
			op = val_type->type_code == RAVI_TNUMINT ? op_movi : op_movfi;
		} else if (var_type->type_code == RAVI_TNUMFLT) {
			op = val_type->type_code == RAVI_TNUMFLT ? op_movf : op_movif;
		}
		instruct_move(proc, op, var_pseudo, val_pseudo, line_number);
	}
}